

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O1

ssize_t __thiscall
libebml::MemIOCallback::write(MemIOCallback *this,int __fd,void *__buf,size_t __n)

{
  binary *pbVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  uVar2 = this->dataBufferPos + (long)__buf;
  if (this->dataBufferMemorySize < uVar2) {
    pbVar1 = (binary *)realloc(this->dataBuffer,uVar2);
    this->dataBuffer = pbVar1;
  }
  memcpy(this->dataBuffer + this->dataBufferPos,(void *)CONCAT44(in_register_00000034,__fd),
         (size_t)__buf);
  uVar2 = this->dataBufferPos + (long)__buf;
  this->dataBufferPos = uVar2;
  if (this->dataBufferTotalSize < uVar2) {
    this->dataBufferTotalSize = uVar2;
  }
  return (ssize_t)__buf;
}

Assistant:

size_t MemIOCallback::write(const void *Buffer, size_t Size)
{
  if (dataBufferMemorySize < dataBufferPos + Size) {
    //We need more memory!
    dataBuffer = (binary *)realloc((void *)dataBuffer, dataBufferPos + Size);
  }
  memcpy(dataBuffer+dataBufferPos, Buffer, Size);
  dataBufferPos += Size;
  if (dataBufferPos > dataBufferTotalSize)
    dataBufferTotalSize = dataBufferPos;

  return Size;
}